

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.h
# Opt level: O0

bool qFuzzyCompare(QPointF *p1,QPointF *p2)

{
  bool bVar1;
  bool bVar2;
  double *in_RSI;
  double *in_RDI;
  double in_stack_00000018;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  if (((*in_RDI == 0.0) && (!NAN(*in_RDI))) || ((*in_RSI == 0.0 && (!NAN(*in_RSI))))) {
    bVar1 = qFuzzyIsNull((double)CONCAT17(in_stack_ffffffffffffffef,
                                          CONCAT16(in_stack_ffffffffffffffee,
                                                   in_stack_ffffffffffffffe8)));
  }
  else {
    bVar1 = qFuzzyCompare(in_stack_00000018,(double)p1);
  }
  bVar2 = false;
  if (bVar1) {
    if (((in_RDI[1] == 0.0) && (!NAN(in_RDI[1]))) || ((in_RSI[1] == 0.0 && (!NAN(in_RSI[1]))))) {
      bVar2 = qFuzzyIsNull((double)(ulong)CONCAT16(in_stack_ffffffffffffffee,
                                                   in_stack_ffffffffffffffe8));
    }
    else {
      bVar2 = qFuzzyCompare(in_stack_00000018,(double)p1);
    }
  }
  return bVar2;
}

Assistant:

constexpr bool qFuzzyCompare(const QPointF &p1, const QPointF &p2) noexcept
    {
        return ((!p1.xp || !p2.xp) ? qFuzzyIsNull(p1.xp - p2.xp) : qFuzzyCompare(p1.xp, p2.xp))
            && ((!p1.yp || !p2.yp) ? qFuzzyIsNull(p1.yp - p2.yp) : qFuzzyCompare(p1.yp, p2.yp));
    }